

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O1

void array_quantile_float(t_array_rangeop *x,t_floatarg f)

{
  float fVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  t_float f_00;
  float fVar5;
  int stride;
  int nitem;
  char *firstitem;
  int arrayonset;
  int local_24;
  float local_20;
  int local_1c;
  float *local_18;
  int local_c;
  
  local_20 = f;
  iVar2 = array_rangeop_getrange(x,(char **)&local_18,&local_1c,&local_24,&local_c);
  if (iVar2 == 0) {
    return;
  }
  if (local_1c < 1) {
    fVar1 = 0.0;
  }
  else {
    fVar1 = 0.0;
    pfVar4 = local_18;
    iVar2 = local_1c;
    do {
      fVar5 = *pfVar4;
      if (fVar5 <= 0.0) {
        fVar5 = 0.0;
      }
      fVar1 = fVar1 + fVar5;
      pfVar4 = (float *)((long)pfVar4 + (long)local_24);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  f_00 = 0.0;
  if (1 < local_1c) {
    fVar1 = fVar1 * local_20;
    iVar2 = 0;
    do {
      fVar5 = *local_18;
      if (fVar5 <= 0.0) {
        fVar5 = 0.0;
      }
      fVar1 = fVar1 - fVar5;
      iVar3 = iVar2;
      if (fVar1 < 0.0) break;
      iVar2 = iVar2 + 1;
      local_18 = (float *)((long)local_18 + (long)local_24);
      iVar3 = local_1c + -1;
    } while (local_1c + -1 != iVar2);
    f_00 = (t_float)iVar3;
  }
  outlet_float((x->x_tc).tc_obj.te_outlet,f_00);
  return;
}

Assistant:

static void array_quantile_float(t_array_rangeop *x, t_floatarg f)
{
    char *itemp, *firstitem;
    int stride, nitem, arrayonset, i;
    double sum;
    if (!array_rangeop_getrange(x, &firstitem, &nitem, &stride, &arrayonset))
        return;
    for (i = 0, sum = 0, itemp = firstitem; i < nitem; i++, itemp += stride)
        sum += (*(t_float *)itemp > 0? *(t_float *)itemp : 0);
    sum *= f;
    for (i = 0, itemp = firstitem; i < (nitem-1); i++, itemp += stride)
    {
        sum -= (*(t_float *)itemp > 0? *(t_float *)itemp : 0);
        if (sum < 0)
            break;
    }
    outlet_float(x->x_outlet, i);
}